

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int TestRptrEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                    _func_int_uchar_ptr_x86Size_x86Reg_int_x86Reg_int *fun,uint testSize)

{
  x86Reg xVar1;
  x86Reg xVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint base;
  long lVar6;
  uchar *puVar7;
  x86Reg *local_48;
  int local_38;
  
  lVar5 = 0;
  puVar7 = stream;
  do {
    local_48 = testBaseRegs;
    lVar6 = 0;
    do {
      if ((testSize & 1) != 0) {
        if ((int)lVar6 != 0 || (int)lVar5 != 0) {
          xVar1 = testIndexRegs[lVar5];
          xVar2 = *local_48;
          EMIT_OP_RPTR(ctx,op,sDWORD,xVar1,1,xVar2,0);
          iVar3 = (*fun)(puVar7,sDWORD,xVar1,1,xVar2,0);
          puVar7 = puVar7 + iVar3;
          EMIT_OP_RPTR(ctx,op,sDWORD,xVar1,1,xVar2,4);
          iVar3 = (*fun)(puVar7,sDWORD,xVar1,1,xVar2,4);
          EMIT_OP_RPTR(ctx,op,sDWORD,xVar1,1,xVar2,0x400);
          iVar4 = (*fun)(puVar7 + iVar3,sDWORD,xVar1,1,xVar2,0x400);
          puVar7 = puVar7 + iVar3 + iVar4;
        }
        if (lVar5 != 0) {
          xVar1 = testIndexRegs[lVar5];
          xVar2 = *local_48;
          EMIT_OP_RPTR(ctx,op,sDWORD,xVar1,2,xVar2,0);
          iVar3 = (*fun)(puVar7,sDWORD,xVar1,2,xVar2,0);
          puVar7 = puVar7 + iVar3;
          EMIT_OP_RPTR(ctx,op,sDWORD,xVar1,2,xVar2,4);
          iVar3 = (*fun)(puVar7,sDWORD,xVar1,2,xVar2,4);
          EMIT_OP_RPTR(ctx,op,sDWORD,xVar1,2,xVar2,0x400);
          iVar4 = (*fun)(puVar7 + iVar3,sDWORD,xVar1,2,xVar2,0x400);
          puVar7 = puVar7 + iVar3 + iVar4;
        }
      }
      if ((testSize & 2) != 0) {
        if ((int)lVar6 != 0 || (int)lVar5 != 0) {
          xVar1 = testIndexRegs[lVar5];
          xVar2 = *local_48;
          EMIT_OP_RPTR(ctx,op,sQWORD,xVar1,1,xVar2,0);
          iVar3 = (*fun)(puVar7,sQWORD,xVar1,1,xVar2,0);
          puVar7 = puVar7 + iVar3;
          EMIT_OP_RPTR(ctx,op,sQWORD,xVar1,1,xVar2,4);
          iVar3 = (*fun)(puVar7,sQWORD,xVar1,1,xVar2,4);
          EMIT_OP_RPTR(ctx,op,sQWORD,xVar1,1,xVar2,0x400);
          iVar4 = (*fun)(puVar7 + iVar3,sQWORD,xVar1,1,xVar2,0x400);
          puVar7 = puVar7 + iVar3 + iVar4;
        }
        if (lVar5 != 0) {
          xVar1 = testIndexRegs[lVar5];
          xVar2 = *local_48;
          EMIT_OP_RPTR(ctx,op,sQWORD,xVar1,2,xVar2,0);
          iVar3 = (*fun)(puVar7,sQWORD,xVar1,2,xVar2,0);
          puVar7 = puVar7 + iVar3;
          EMIT_OP_RPTR(ctx,op,sQWORD,xVar1,2,xVar2,4);
          iVar3 = (*fun)(puVar7,sQWORD,xVar1,2,xVar2,4);
          EMIT_OP_RPTR(ctx,op,sQWORD,xVar1,2,xVar2,0x400);
          iVar4 = (*fun)(puVar7 + iVar3,sQWORD,xVar1,2,xVar2,0x400);
          puVar7 = puVar7 + iVar3 + iVar4;
        }
      }
      lVar6 = lVar6 + 1;
      local_48 = local_48 + 1;
    } while (lVar6 != 10);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 9);
  local_38 = (int)stream;
  return (int)puVar7 - local_38;
}

Assistant:

int TestRptrEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift), unsigned testSize = testSizeDword | testSizeQword)
{
	unsigned char *start = stream;

	for(unsigned index = 0; index < sizeof(testIndexRegs) / sizeof(testIndexRegs[0]); index++)
	{
		for(unsigned base = 0; base < sizeof(testBaseRegs) / sizeof(testBaseRegs[0]); base++)
		{
			if(testSize & testSizeDword)
			{
				if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
				{
					EMIT_OP_RPTR(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
					stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
					EMIT_OP_RPTR(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
					stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
					EMIT_OP_RPTR(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
					stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
				}

				if(testIndexRegs[index] != rNONE)
				{
					EMIT_OP_RPTR(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
					stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
					EMIT_OP_RPTR(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
					stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
					EMIT_OP_RPTR(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
					stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
				}
			}

			if(testSize & testSizeQword)
			{
				// skip RDI-based addressing
				if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
				{
					EMIT_OP_RPTR(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
					stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
					EMIT_OP_RPTR(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
					stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
					EMIT_OP_RPTR(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
					stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
				}

				if(testIndexRegs[index] != rNONE)
				{
					EMIT_OP_RPTR(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
					stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
					EMIT_OP_RPTR(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
					stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
					EMIT_OP_RPTR(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
					stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
				}
			}
		}
	}

	return int(stream - start);
}